

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnSetTrain(XL *out,char *train_path)

{
  XL pvVar1;
  allocator local_31;
  string local_30 [32];
  
  pvVar1 = *out;
  std::__cxx11::string::string(local_30,train_path,&local_31);
  std::__cxx11::string::operator=((string *)((long)pvVar1 + 200),local_30);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

XL_DLL int XLearnSetTrain(XL *out, const char *train_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().train_set_file = std::string(train_path);
  API_END();
}